

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fpu_helper.c
# Opt level: O0

uint64_t helper_float_ceil_2008_l_s_mips64(CPUMIPSState_conflict5 *env,uint32_t fst0)

{
  uint uVar1;
  int iVar2;
  uintptr_t unaff_retaddr;
  uint64_t local_20;
  uint64_t dt2;
  uint32_t fst0_local;
  CPUMIPSState_conflict5 *env_local;
  
  set_float_rounding_mode(2,&(env->active_fpu).fp_status);
  local_20 = float32_to_int64_mips64(fst0,&(env->active_fpu).fp_status);
  restore_rounding_mode(env);
  uVar1 = get_float_exception_flags(&(env->active_fpu).fp_status);
  if (((uVar1 & 1) != 0) && (iVar2 = float32_is_any_nan(fst0), iVar2 != 0)) {
    local_20 = 0;
  }
  update_fcr31(env,unaff_retaddr);
  return local_20;
}

Assistant:

uint64_t helper_float_ceil_2008_l_s(CPUMIPSState *env, uint32_t fst0)
{
    uint64_t dt2;

    set_float_rounding_mode(float_round_up, &env->active_fpu.fp_status);
    dt2 = float32_to_int64(fst0, &env->active_fpu.fp_status);
    restore_rounding_mode(env);
    if (get_float_exception_flags(&env->active_fpu.fp_status)
            & float_flag_invalid) {
        if (float32_is_any_nan(fst0)) {
            dt2 = 0;
        }
    }
    update_fcr31(env, GETPC());
    return dt2;
}